

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O0

void __thiscall
antlr::CharScanner::CharScanner(CharScanner *this,LexerSharedInputState *state,bool case_sensitive)

{
  byte in_DL;
  CharScanner *in_RDI;
  RefToken *p;
  RefCount<antlr::LexerInputState> *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_antlr::CharScannerLiteralsLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__comp;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_antlr::CharScannerLiteralsLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_ffffffffffffffd0;
  CharScannerLiteralsLess local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  TokenStream::TokenStream(&in_RDI->super_TokenStream);
  (in_RDI->super_TokenStream)._vptr_TokenStream = (_func_int **)&PTR___cxa_pure_virtual_004fbb48;
  std::__cxx11::string::string((string *)&in_RDI->text);
  in_RDI->saveConsumedInput = true;
  in_RDI->caseSensitive = (bool)(local_11 & 1);
  __comp = &in_RDI->literals;
  CharScannerLiteralsLess::CharScannerLiteralsLess(&local_20,in_RDI);
  this_00 = (RefCount<antlr::LexerInputState> *)&stack0xffffffffffffffd3;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               *)0x1b0f5b);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_antlr::CharScannerLiteralsLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(in_stack_ffffffffffffffd0,(CharScannerLiteralsLess *)__comp,(allocator_type *)in_RDI);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                *)0x1b0f7b);
  p = &in_RDI->_returnToken;
  TokenRefCount<antlr::Token>::TokenRefCount((TokenRefCount<antlr::Token> *)this_00,(Token *)p);
  RefCount<antlr::LexerInputState>::RefCount(this_00,(RefCount<antlr::LexerInputState> *)p);
  in_RDI->commitToPath = false;
  in_RDI->tabsize = 8;
  in_RDI->traceDepth = 0;
  (*(in_RDI->super_TokenStream)._vptr_TokenStream[0x2a])(in_RDI,CommonToken::factory);
  return;
}

Assistant:

CharScanner::CharScanner( const LexerSharedInputState& state, bool case_sensitive )
	: saveConsumedInput(true) //, caseSensitiveLiterals(true)
	, caseSensitive(case_sensitive)
	, literals(CharScannerLiteralsLess(this))
	, inputState(state)
	, commitToPath(false)
	, tabsize(8)
	, traceDepth(0)
{
	setTokenObjectFactory(&CommonToken::factory);
}